

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O3

PAL_ERROR __thiscall CorUnix::CPalThread::Leave(CPalThread *this,PAL_Boundary param_1)

{
  if (this->m_fInPal != false) {
    this->m_fInPal = false;
    return 0;
  }
  if (PAL_InitializeChakraCoreCalled) {
    return 0x32;
  }
  abort();
}

Assistant:

PAL_ERROR CPalThread::Leave(PAL_Boundary /* boundary */)
{
    if (!m_fInPal)
    {
        WARN("Leave called on a thread that is not running in this PAL\n");
        return ERROR_NOT_SUPPORTED;
    }

    PAL_ERROR palError = ERROR_SUCCESS;

    m_fInPal = FALSE;

    return palError;
}